

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O1

ImGuiDockContextPruneNodeData * __thiscall
ImPool<ImGuiDockContextPruneNodeData>::Add(ImPool<ImGuiDockContextPruneNodeData> *this)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  ImGuiDockContextPruneNodeData *pIVar4;
  ImGuiDockContextPruneNodeData *__dest;
  int iVar5;
  int iVar6;
  
  iVar2 = this->FreeIdx;
  iVar6 = (this->Buf).Size;
  if (iVar2 == iVar6) {
    iVar5 = iVar6 + 1;
    iVar3 = (this->Buf).Capacity;
    if (iVar3 <= iVar6) {
      if (iVar3 == 0) {
        iVar6 = 8;
      }
      else {
        iVar6 = iVar3 / 2 + iVar3;
      }
      if (iVar6 <= iVar5) {
        iVar6 = iVar5;
      }
      if (iVar3 < iVar6) {
        if (GImGui != (ImGuiContext *)0x0) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + 1;
        }
        __dest = (ImGuiDockContextPruneNodeData *)
                 (*GImAllocatorAllocFunc)((long)iVar6 << 4,GImAllocatorUserData);
        pIVar4 = (this->Buf).Data;
        if (pIVar4 != (ImGuiDockContextPruneNodeData *)0x0) {
          memcpy(__dest,pIVar4,(long)(this->Buf).Size << 4);
          pIVar4 = (this->Buf).Data;
          if ((pIVar4 != (ImGuiDockContextPruneNodeData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(pIVar4,GImAllocatorUserData);
        }
        (this->Buf).Data = __dest;
        (this->Buf).Capacity = iVar6;
      }
    }
    (this->Buf).Size = iVar5;
    iVar6 = this->FreeIdx + 1;
  }
  else {
    if (iVar6 <= iVar2) goto LAB_001f8071;
    iVar6 = (this->Buf).Data[iVar2].CountWindows;
  }
  this->FreeIdx = iVar6;
  if (iVar2 < (this->Buf).Size) {
    pIVar4 = (this->Buf).Data + iVar2;
    pIVar4->CountWindows = 0;
    pIVar4->CountChildWindows = 0;
    pIVar4->CountChildNodes = 0;
    pIVar4->RootId = 0;
    if (iVar2 < (this->Buf).Size) {
      return (this->Buf).Data + iVar2;
    }
  }
LAB_001f8071:
  __assert_fail("i < Size",
                "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/imgui/imgui.h"
                ,0x62f,
                "T &ImVector<ImGuiDockContextPruneNodeData>::operator[](int) [T = ImGuiDockContextPruneNodeData]"
               );
}

Assistant:

T*          Add()                               { int idx = FreeIdx; if (idx == Buf.Size) { Buf.resize(Buf.Size + 1); FreeIdx++; } else { FreeIdx = *(int*)&Buf[idx]; } IM_PLACEMENT_NEW(&Buf[idx]) T(); return &Buf[idx]; }